

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall pstore::file::range_lock::range_lock(range_lock *this,range_lock *other)

{
  this->file_ = other->file_;
  this->offset_ = other->offset_;
  this->size_ = other->size_;
  this->kind_ = other->kind_;
  this->locked_ = other->locked_;
  other->file_ = (file_base *)0x0;
  other->locked_ = false;
  return;
}

Assistant:

range_lock::range_lock (range_lock && other) noexcept
                : file_{other.file_}
                , offset_ (other.offset_)
                , size_ (other.size_)
                , kind_ (other.kind_)
                , locked_ (other.locked_) {

            other.file_ = nullptr;
            other.locked_ = false;
        }